

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_CutCheckMffc_rec(Jf_Man_t *p,int *pCut,int Limit)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_2c;
  int fRecur;
  int Var;
  int i;
  int Limit_local;
  int *pCut_local;
  Jf_Man_t *p_local;
  
  fRecur = 1;
  while( true ) {
    iVar1 = Jf_CutSize(pCut);
    bVar3 = false;
    if (fRecur <= iVar1) {
      local_2c = Jf_CutVar(pCut,fRecur);
      bVar3 = local_2c != 0;
    }
    if (!bVar3) {
      return 1;
    }
    iVar1 = Gia_ObjRefDecId(p->pGia,local_2c);
    bVar3 = false;
    if (iVar1 == 0) {
      piVar2 = Jf_ObjCutBest(p,local_2c);
      iVar1 = Jf_CutIsTriv(piVar2,local_2c);
      bVar3 = iVar1 == 0;
    }
    Vec_IntPush(p->vTemp,local_2c);
    iVar1 = Vec_IntSize(p->vTemp);
    if (Limit <= iVar1) break;
    if (bVar3) {
      piVar2 = Jf_ObjCutBest(p,local_2c);
      iVar1 = Jf_CutCheckMffc_rec(p,piVar2,Limit);
      if (iVar1 == 0) {
        return 0;
      }
    }
    fRecur = fRecur + 1;
  }
  return 0;
}

Assistant:

int Jf_CutCheckMffc_rec( Jf_Man_t * p, int * pCut, int Limit )
{
    int i, Var;
    Jf_CutForEachVar( pCut, Var, i )
    {
        int fRecur = (!Gia_ObjRefDecId(p->pGia, Var) && !Jf_CutIsTriv(Jf_ObjCutBest(p, Var), Var));
        Vec_IntPush( p->vTemp, Var );
        if ( Vec_IntSize(p->vTemp) >= Limit )
            return 0;
        if ( fRecur && !Jf_CutCheckMffc_rec( p, Jf_ObjCutBest(p, Var), Limit ) )
            return 0;
    }
    return 1;
}